

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.hpp
# Opt level: O0

void __thiscall
duckdb::MiniZStream::Compress
          (MiniZStream *this,char *uncompressed_data,size_t uncompressed_size,char *out_data,
          size_t *out_size)

{
  mz_ulong mVar1;
  int iVar2;
  mz_ulong crc_00;
  long in_RCX;
  ulong in_RDX;
  uchar *in_RSI;
  mz_stream_s *in_RDI;
  long *in_R8;
  mz_ulong crc;
  uchar *gzip_footer;
  uchar *gzip_body;
  uchar *gzip_header;
  int mz_ret;
  
  iVar2 = duckdb_miniz::mz_deflateInit2(in_RDI,6,8,-0xf,1,0);
  if (iVar2 != 0) {
    FormatException(this,uncompressed_data,uncompressed_size._4_4_);
  }
  *(undefined4 *)&in_RDI[1].next_in = 2;
  InitializeGZIPHeader((uchar *)0x5a6621);
  in_RDI->next_in = in_RSI;
  in_RDI->avail_in = (uint)in_RDX;
  in_RDI->next_out = (uchar *)(in_RCX + 10);
  in_RDI->avail_out = (int)*in_R8 - 10;
  iVar2 = duckdb_miniz::mz_deflate(in_RDI,4);
  if ((iVar2 != 0) && (iVar2 != 1)) {
    FormatException(this,uncompressed_data,uncompressed_size._4_4_);
  }
  mVar1 = in_RDI->total_out;
  crc_00 = duckdb_miniz::mz_crc32(0,in_RSI,in_RDX);
  InitializeGZIPFooter((uchar *)(in_RCX + 10) + mVar1,crc_00,in_RDX);
  *in_R8 = in_RDI->total_out + 0x12;
  return;
}

Assistant:

void Compress(const char *uncompressed_data, size_t uncompressed_size, char *out_data, size_t *out_size) {
		auto mz_ret =
		    mz_deflateInit2(&stream, duckdb_miniz::MZ_DEFAULT_LEVEL, MZ_DEFLATED, -MZ_DEFAULT_WINDOW_BITS, 1, 0);
		if (mz_ret != duckdb_miniz::MZ_OK) {
			FormatException("Failed to initialize miniz", mz_ret);
		}
		type = MiniZStreamType::MINIZ_TYPE_DEFLATE;

		auto gzip_header = reinterpret_cast<unsigned char *>(out_data);
		InitializeGZIPHeader(gzip_header);

		auto gzip_body = gzip_header + GZIP_HEADER_MINSIZE;

		stream.next_in = reinterpret_cast<const unsigned char *>(uncompressed_data);
		stream.avail_in = static_cast<unsigned int>(uncompressed_size);
		stream.next_out = gzip_body;
		stream.avail_out = static_cast<unsigned int>(*out_size - GZIP_HEADER_MINSIZE);

		mz_ret = mz_deflate(&stream, duckdb_miniz::MZ_FINISH);
		if (mz_ret != duckdb_miniz::MZ_OK && mz_ret != duckdb_miniz::MZ_STREAM_END) {
			FormatException("Failed to compress GZIP block", mz_ret);
		}
		auto gzip_footer = gzip_body + stream.total_out;
		auto crc = duckdb_miniz::mz_crc32(MZ_CRC32_INIT, reinterpret_cast<const unsigned char *>(uncompressed_data),
		                                  uncompressed_size);
		InitializeGZIPFooter(gzip_footer, crc, uncompressed_size);

		*out_size = stream.total_out + GZIP_HEADER_MINSIZE + GZIP_FOOTER_SIZE;
	}